

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O2

void Abc_NtkMaxFlowCollectCut_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  long lVar2;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    if ((pObj->field_0x14 & 0x10) != 0) {
      Vec_PtrPush(vNodes,pObj);
      return;
    }
    for (lVar2 = 0; lVar2 < (pObj->vFanins).nSize; lVar2 = lVar2 + 1) {
      Abc_NtkMaxFlowCollectCut_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]],vNodes);
    }
  }
  return;
}

Assistant:

void Abc_NtkMaxFlowCollectCut_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNext;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( pObj->fMarkA )
    {
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    Abc_ObjForEachFanin( pObj, pNext, i )
        Abc_NtkMaxFlowCollectCut_rec( pNext, vNodes );
}